

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QWidget_*,_QRect> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget*,QRect>>::findNode<QWidget*>
          (Data<QHashPrivate::Node<QWidget*,QRect>> *this,QWidget **key)

{
  ulong uVar1;
  Node<QWidget_*,_QRect> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QWidget*>(this,key);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<QWidget_*,_QRect> *)0x0;
  }
  else {
    pNVar2 = (Node<QWidget_*,_QRect> *)((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }